

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::PassRunner::run(PassRunner *this)

{
  pointer *pppPVar1;
  PassRunner **ppPVar2;
  pointer puVar3;
  _Head_base<0UL,_wasm::Export_*,_false> _Var4;
  Pass *pPVar5;
  pointer puVar6;
  Function *func;
  int iVar7;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_1;
  Module *pMVar8;
  long lVar9;
  const_iterator cVar10;
  ostream *poVar11;
  Module *wasm;
  _Head_base<0UL,_wasm::Export_*,_false> _Var12;
  pointer puVar13;
  _Hash_node_base *p_Var14;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar15;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  char *pcVar16;
  long lVar17;
  bool bVar18;
  Name name;
  Name name_00;
  string_view sVar19;
  undefined1 local_3a0 [8];
  anon_class_16_2_032a43cd flush;
  undefined1 auStack_218 [8];
  vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> stack;
  ios_base local_198 [264];
  _Head_base<0UL,_wasm::Pass_*,_false> local_90;
  long local_88;
  double local_70;
  pointer local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  char *local_58;
  long local_50;
  PassOptions *local_48;
  double local_40;
  PassRunner *local_38;
  
  if (this->ran == true) {
    __assert_fail("!ran",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x2b8,"void wasm::PassRunner::run()");
  }
  this->ran = true;
  local_60 = &(this->skippedPasses)._M_h;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(local_60);
  if (run()::passDebug == '\0') {
    run();
  }
  local_38 = this;
  if ((run::passDebug == 2 || (this->options).debug != false) ||
     ((run::passDebug != 0 && (this->isNested == false)))) {
    pcVar16 = "passes";
    bVar18 = this->isNested != false;
    if (bVar18) {
      pcVar16 = "nested passes";
    }
    lVar17 = 6;
    if (bVar18) {
      lVar17 = 0xd;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[PassRunner] running ",0x15);
    local_58 = pcVar16;
    local_50 = lVar17;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    pMVar8 = (Module *)
             (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    wasm = (Module *)
           (this->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar8 == wasm) {
      _Var12._M_head_impl = (Export *)0x0;
    }
    else {
      _Var12._M_head_impl = (Export *)0x0;
      do {
        _Var4._M_head_impl =
             *(Export **)
              &(pMVar8->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
        if (_Var4._M_head_impl < _Var12._M_head_impl) {
          _Var4._M_head_impl = _Var12._M_head_impl;
        }
        _Var12._M_head_impl = _Var4._M_head_impl;
        pMVar8 = (Module *)
                 &(pMVar8->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (pMVar8 != wasm);
    }
    if ((2 < run::passDebug) && (this->isNested == false)) {
      sVar19 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xb8f633),SUB81(wasm,0));
      wasm = this->wasm;
      name.super_IString.str._M_str = (char *)wasm;
      name.super_IString.str._M_len = (size_t)sVar19._M_str;
      dumpWasm((wasm *)sVar19._M_len,name,wasm);
    }
    local_48 = &this->options;
    puVar13 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (this->passes).
               super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar13 == local_68) {
      local_40 = 0.0;
    }
    else {
      local_40 = 0.0;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_218);
        if ((run::passDebug == 2) && (this->isNested == false)) {
          poVar11 = std::operator<<((ostream *)
                                    &stack.
                                     super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,this->wasm);
          local_3a0[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[PassRunner]   running pass: ",0x1d);
        pPVar5 = (puVar13->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                 ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pPVar5->name)._M_dataplus._M_p,
                             (pPVar5->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"... ",4);
        if (_Var12._M_head_impl !=
            (Export *)
            (((puVar13->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
              super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length) {
          pMVar8 = (Module *)0x0;
          do {
            local_3a0[0] = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_3a0,1);
            pMVar8 = (Module *)
                     ((long)&(pMVar8->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
            wasm = (Module *)
                   ((long)_Var12._M_head_impl -
                   (((puVar13->_M_t).
                     super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name).
                   _M_string_length);
          } while (pMVar8 < wasm);
        }
        lVar17 = std::chrono::_V2::steady_clock::now();
        iVar7 = (*((puVar13->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
        if ((char)iVar7 == '\0') {
          runPass(local_38,(puVar13->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
        }
        else {
          puVar6 = (local_38->wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar15 = (local_38->wasm->functions).
                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar6;
              puVar15 = puVar15 + 1) {
            func = (puVar15->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
              runPassOnFunction(local_38,(puVar13->_M_t).
                                         super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                         .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,
                                func);
            }
          }
        }
        lVar9 = std::chrono::_V2::steady_clock::now();
        local_70 = (double)(lVar9 - lVar17) / 1000000000.0;
        poVar11 = std::ostream::_M_insert<double>(local_70);
        this = local_38;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," seconds.",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if (((this->options).validate == true) && (this->isNested == false)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[PassRunner]   (validating)\n",0x1c);
          bVar18 = WasmValidator::validate((WasmValidator *)local_3a0,this->wasm,local_48);
          if (!bVar18) {
            poVar11 = std::operator<<((ostream *)&std::cout,this->wasm);
            local_3a0[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,1);
            if (run::passDebug < 2) {
              Fatal::Fatal((Fatal *)local_3a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&flush.this,"Last pass (",0xb);
              pPVar5 = (puVar13->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&flush.this,(pPVar5->name)._M_dataplus._M_p,
                         (pPVar5->name)._M_string_length);
              Fatal::operator<<((Fatal *)local_3a0,
                                (char (*) [128])
                                ") broke validation. Run with BINARYEN_PASS_DEBUG=2 in the env to see the earlier state, or 3 to dump byn-* files for each pass\n"
                               );
            }
            else {
              Fatal::Fatal((Fatal *)local_3a0);
              ppPVar2 = &flush.this;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar2,"Last pass (",0xb);
              pPVar5 = (puVar13->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar2,(pPVar5->name)._M_dataplus._M_p,
                         (pPVar5->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar2,") broke validation. Here is the module before: \n",0x30
                        );
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar2,(char *)local_90._M_head_impl,local_88);
              Fatal::operator<<((Fatal *)local_3a0,(char (*) [2])0xbbb18f);
              std::__cxx11::string::~string((string *)&local_90);
            }
            Fatal::~Fatal((Fatal *)local_3a0);
          }
        }
        if (2 < run::passDebug) {
          pPVar5 = (puVar13->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
          sVar19._M_str = (char *)0x0;
          sVar19._M_len = (size_t)(pPVar5->name)._M_dataplus._M_p;
          sVar19 = IString::interned((IString *)(pPVar5->name)._M_string_length,sVar19,SUB81(wasm,0)
                                    );
          wasm = this->wasm;
          name_00.super_IString.str._M_str = (char *)wasm;
          name_00.super_IString.str._M_len = (size_t)sVar19._M_str;
          dumpWasm((wasm *)sVar19._M_len,name_00,wasm);
        }
        local_40 = local_40 + local_70;
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_218);
        std::ios_base::~ios_base(local_198);
        puVar13 = puVar13 + 1;
      } while (puVar13 != local_68);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[PassRunner] ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," took ",6);
    poVar11 = std::ostream::_M_insert<double>(local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," seconds.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (((this->options).validate != false) && (this->isNested == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[PassRunner] (final validation)\n",0x20);
      bVar18 = WasmValidator::validate((WasmValidator *)auStack_218,this->wasm,local_48);
      if (!bVar18) {
        poVar11 = std::operator<<((ostream *)&std::cout,this->wasm);
        auStack_218[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,auStack_218,1);
        Fatal::Fatal((Fatal *)auStack_218);
        Fatal::operator<<((Fatal *)auStack_218,(char (*) [32])"final module does not validate\n");
        Fatal::~Fatal((Fatal *)auStack_218);
      }
    }
  }
  else {
    local_3a0 = (undefined1  [8])auStack_218;
    auStack_218 = (undefined1  [8])0x0;
    stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar13 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    flush.stack = (vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)this;
    if (puVar13 != puVar3) {
      do {
        iVar7 = (*((puVar13->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
        if ((char)iVar7 == '\0') {
          run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_3a0);
          runPass(local_38,(puVar13->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
        }
        else {
          local_90._M_head_impl =
               (puVar13->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
          std::vector<wasm::Pass*,std::allocator<wasm::Pass*>>::emplace_back<wasm::Pass*>
                    ((vector<wasm::Pass*,std::allocator<wasm::Pass*>> *)auStack_218,
                     &local_90._M_head_impl);
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar3);
    }
    run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_3a0);
    this = local_38;
    if (auStack_218 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_218,
                      (long)stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_218);
    }
  }
  if ((this->isNested == false) &&
     (p_Var14 = (this->options).passesToSkip._M_h._M_before_begin._M_nxt,
     p_Var14 != (_Hash_node_base *)0x0)) {
    pppPVar1 = &stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    do {
      auStack_218 = (undefined1  [8])pppPVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_218,p_Var14[1]._M_nxt,
                 (long)&(p_Var14[2]._M_nxt)->_M_nxt + (long)p_Var14[1]._M_nxt);
      cVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(local_60,(key_type *)auStack_218);
      if (cVar10.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"warning: --",0xb);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)auStack_218,
                             (long)stack.
                                   super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," was requested to be skipped, ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"but it was not found in the passes that were run.\n",0x32);
      }
      if (auStack_218 != (undefined1  [8])pppPVar1) {
        operator_delete((void *)auStack_218,
                        (long)stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1);
      }
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void PassRunner::run() {
  assert(!ran);
  ran = true;

  // As we run passes, we'll notice which we skip.
  skippedPasses.clear();

  static const int passDebug = getPassDebug();
  // Emit logging information when asked for. At passDebug level 1+ we log
  // the main passes, while in 2 we also log nested ones. Note that for
  // nested ones we can only emit their name - we can't validate, or save the
  // file, or print, as the wasm may be in an intermediate state that is not
  // valid.
  if (options.debug || (passDebug == 2 || (passDebug && !isNested))) {
    // for debug logging purposes, run each pass in full before running the
    // other
    auto totalTime = std::chrono::duration<double>(0);
    auto what = isNested ? "nested passes" : "passes";
    std::cerr << "[PassRunner] running " << what << std::endl;
    size_t padding = 0;
    for (auto& pass : passes) {
      padding = std::max(padding, pass->name.size());
    }
    if (passDebug >= 3 && !isNested) {
      dumpWasm("before", wasm);
    }
    for (auto& pass : passes) {
      // ignoring the time, save a printout of the module before, in case this
      // pass breaks it, so we can print the before and after
      std::stringstream moduleBefore;
      if (passDebug == 2 && !isNested) {
        moduleBefore << *wasm << '\n';
      }
      // prepare to run
      std::cerr << "[PassRunner]   running pass: " << pass->name << "... ";
      for (size_t i = 0; i < padding - pass->name.size(); i++) {
        std::cerr << ' ';
      }
      auto before = std::chrono::steady_clock::now();
      if (pass->isFunctionParallel()) {
        // function-parallel passes should get a new instance per function
        ModuleUtils::iterDefinedFunctions(
          *wasm, [&](Function* func) { runPassOnFunction(pass.get(), func); });
      } else {
        runPass(pass.get());
      }
      auto after = std::chrono::steady_clock::now();
      std::chrono::duration<double> diff = after - before;
      std::cerr << diff.count() << " seconds." << std::endl;
      totalTime += diff;
      if (options.validate && !isNested) {
        // validate, ignoring the time
        std::cerr << "[PassRunner]   (validating)\n";
        if (!WasmValidator().validate(*wasm, options)) {
          std::cout << *wasm << '\n';
          if (passDebug >= 2) {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Here is the module before: \n"
                    << moduleBefore.str() << "\n";
          } else {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Run with BINARYEN_PASS_DEBUG=2 "
                       "in the env to see the earlier state, or 3 to dump "
                       "byn-* files for each pass\n";
          }
        }
      }
      if (passDebug >= 3) {
        dumpWasm(pass->name, wasm);
      }
    }
    std::cerr << "[PassRunner] " << what << " took " << totalTime.count()
              << " seconds." << std::endl;
    if (options.validate && !isNested) {
      std::cerr << "[PassRunner] (final validation)\n";
      if (!WasmValidator().validate(*wasm, options)) {
        std::cout << *wasm << '\n';
        Fatal() << "final module does not validate\n";
      }
    }
  } else {
    // non-debug normal mode, run them in an optimal manner - for locality it is
    // better to run as many passes as possible on a single function before
    // moving to the next
    std::vector<Pass*> stack;
    auto flush = [&]() {
      if (stack.size() > 0) {
        // run the stack of passes on all the functions, in parallel
        size_t num = ThreadPool::get()->size();
        std::vector<std::function<ThreadWorkState()>> doWorkers;
        std::atomic<size_t> nextFunction;
        nextFunction.store(0);
        size_t numFunctions = wasm->functions.size();
        for (size_t i = 0; i < num; i++) {
          doWorkers.push_back([&]() {
            auto index = nextFunction.fetch_add(1);
            // get the next task, if there is one
            if (index >= numFunctions) {
              return ThreadWorkState::Finished; // nothing left
            }
            Function* func = this->wasm->functions[index].get();
            if (!func->imported()) {
              // do the current task: run all passes on this function
              for (auto* pass : stack) {
                runPassOnFunction(pass, func);
              }
            }
            if (index + 1 == numFunctions) {
              return ThreadWorkState::Finished; // we did the last one
            }
            return ThreadWorkState::More;
          });
        }
        ThreadPool::get()->work(doWorkers);
      }
      stack.clear();
    };
    for (auto& pass : passes) {
      if (pass->isFunctionParallel()) {
        stack.push_back(pass.get());
      } else {
        flush();
        runPass(pass.get());
      }
    }
    flush();
  }

  if (!isNested) {
    // All the passes the user requested to skip should have been seen, and
    // skipped. If not, the user may have had a typo in the name of a pass to
    // skip, and we will warn. (We don't do this in a nested runner because
    // those are used for various internal tasks inside passes, which would lead
    // to many spurious warnings.)
    for (auto pass : options.passesToSkip) {
      if (!skippedPasses.count(pass)) {
        std::cerr << "warning: --" << pass << " was requested to be skipped, "
                  << "but it was not found in the passes that were run.\n";
      }
    }
  }
}